

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

void bssl::dtls_clear_outgoing_messages(SSL *ssl)

{
  SSL *ssl_local;
  
  InplaceVector<bssl::DTLSOutgoingMessage,_7UL>::clear(&ssl->d1->outgoing_messages);
  std::unique_ptr<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>::operator=
            (&ssl->d1->sent_records,(nullptr_t)0x0);
  ssl->d1->outgoing_written = '\0';
  ssl->d1->outgoing_offset = 0;
  *(ushort *)ssl->d1 = *(ushort *)ssl->d1 & 0xfffd;
  *(ushort *)ssl->d1 = *(ushort *)ssl->d1 & 0xfffb;
  *(ushort *)ssl->d1 = *(ushort *)ssl->d1 & 0xffdf;
  dtls_clear_unused_write_epochs(ssl);
  return;
}

Assistant:

void dtls_clear_outgoing_messages(SSL *ssl) {
  ssl->d1->outgoing_messages.clear();
  ssl->d1->sent_records = nullptr;
  ssl->d1->outgoing_written = 0;
  ssl->d1->outgoing_offset = 0;
  ssl->d1->outgoing_messages_complete = false;
  ssl->d1->flight_has_reply = false;
  ssl->d1->sending_flight = false;
  dtls_clear_unused_write_epochs(ssl);
}